

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_cursor.cpp
# Opt level: O2

int Am_Cursor_Data::remove(char *__filename)

{
  Am_Cursor_Data *pAVar1;
  Am_Cursor_Data **ppAVar2;
  Am_Cursor_Data **ppAVar3;
  
  ppAVar3 = &list;
  ppAVar2 = (Am_Cursor_Data **)(Am_Cursor_Data *)0x0;
  do {
    pAVar1 = *ppAVar3;
    if (pAVar1 == (Am_Cursor_Data *)0x0) {
LAB_00274f24:
      return (int)ppAVar2;
    }
    if (pAVar1 == (Am_Cursor_Data *)__filename) {
      if ((Am_Cursor_Data *)ppAVar2 == (Am_Cursor_Data *)0x0) {
        ppAVar2 = &list;
      }
      else {
        ppAVar2 = &((Am_Cursor_Data *)ppAVar2)->next;
      }
      (((Am_Cursor_Data *)ppAVar2)->super_Am_Wrapper).super_Am_Registered_Type.
      _vptr_Am_Registered_Type = (_func_int **)pAVar1->next;
      goto LAB_00274f24;
    }
    ppAVar3 = &pAVar1->next;
    ppAVar2 = (Am_Cursor_Data **)pAVar1;
  } while( true );
}

Assistant:

void
Am_Cursor_Data::remove(Am_Cursor_Data *cursor)
{
  Am_Cursor_Data *prev = nullptr;
  Am_Cursor_Data *curr = list;
  while (curr) {
    if (curr == cursor) {
      if (prev)
        prev->next = curr->next;
      else
        list = curr->next;
      return;
    }
    prev = curr;
    curr = curr->next;
  }
}